

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

void __thiscall mpt::layout::graph::transform3::transform3(transform3 *this)

{
  long lVar1;
  
  (this->super_type)._ref._val = 1;
  (this->super_type).super_transform._vptr_transform = (_func_int **)&PTR_dimensions_0014c138;
  lVar1 = 0;
  do {
    data::data((data *)((long)&this->_dim[0].super_value_apply.scale + lVar1),-1);
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0x78);
  (this->_base).super_point<float> = (point<float>)0x0;
  data::data(this->_dim,1);
  data::data(this->_dim + 1,2);
  data::data(this->_dim + 2,3);
  return;
}

Assistant:

layout::graph::transform3::transform3()
{
	new (&_dim[0]) data(AxisStyleX);
	new (&_dim[1]) data(AxisStyleY);
	new (&_dim[2]) data(AxisStyleZ);
}